

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergePartialFromCodedStream
          (CodeGeneratorResponse *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  bool bVar6;
  Limit limit;
  string *psVar7;
  CodeGeneratorResponse_File *this_00;
  uint8 *puVar8;
  uint32 tag;
  uint32 local_3c;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->file_).super_RepeatedPtrFieldBase;
  do {
    while( true ) {
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (tag = (uint32)(char)*puVar8, -1 < (char)*puVar8)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar8 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      if (tag >> 3 == 0xf) break;
      if ((tag >> 3 != 1) || ((tag & 7) != 2)) goto LAB_0018afe3;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if (this->error_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->error_ = psVar7;
      }
      bVar6 = internal::WireFormatLite::ReadString(input,this->error_);
      if (!bVar6) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->error_->_M_dataplus)._M_p,(int)this->error_->_M_string_length,PARSE);
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (*puVar8 == 'z')) {
        do {
          input->buffer_ = puVar8 + 1;
LAB_0018b009:
          iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
          iVar4 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar3 < iVar4) {
            ppvVar5 = (this->file_).super_RepeatedPtrFieldBase.elements_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            this_00 = (CodeGeneratorResponse_File *)ppvVar5[iVar3];
          }
          else {
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.total_size_;
            if (iVar4 == iVar3) {
              internal::RepeatedPtrFieldBase::Reserve(local_38,iVar3 + 1);
            }
            piVar1 = &(this->file_).super_RepeatedPtrFieldBase.allocated_size_;
            *piVar1 = *piVar1 + 1;
            this_00 = internal::
                      GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::
                      New();
            ppvVar5 = (this->file_).super_RepeatedPtrFieldBase.elements_;
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            ppvVar5[iVar3] = this_00;
          }
          puVar8 = input->buffer_;
          if ((puVar8 < input->buffer_end_) && (uVar2 = *puVar8, -1 < (char)uVar2)) {
            input->buffer_ = puVar8 + 1;
            local_3c = (int)(char)uVar2;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
            if (!bVar6) {
              return false;
            }
          }
          iVar3 = input->recursion_depth_;
          input->recursion_depth_ = iVar3 + 1;
          if (input->recursion_limit_ <= iVar3) {
            return false;
          }
          limit = io::CodedInputStream::PushLimit(input,local_3c);
          bVar6 = CodeGeneratorResponse_File::MergePartialFromCodedStream(this_00,input);
          if (!bVar6) {
            return false;
          }
          if (input->legitimate_message_end_ != true) {
            return false;
          }
          io::CodedInputStream::PopLimit(input,limit);
          if (0 < input->recursion_depth_) {
            input->recursion_depth_ = input->recursion_depth_ + -1;
          }
          puVar8 = input->buffer_;
        } while ((puVar8 < input->buffer_end_) && (*puVar8 == 'z'));
        if ((input->buffer_ == input->buffer_end_) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
    }
    if ((tag & 7) == 2) goto LAB_0018b009;
LAB_0018afe3:
    if ((tag & 7) == 4) {
      return true;
    }
    bVar6 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string error = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_error()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->error().data(), this->error().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        break;
      }

      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}